

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeVLD2LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  long lVar3;
  int iVar4;
  
  switch(Insn >> 10 & 3) {
  case 0:
    iVar4 = 1;
    goto LAB_001deef1;
  case 1:
    uVar1 = Insn & 0x20;
    break;
  case 2:
    if ((Insn & 0x20) != 0) {
      return MCDisassembler_Fail;
    }
    uVar1 = Insn & 0x40;
    break;
  case 3:
    return MCDisassembler_Fail;
  }
  iVar4 = 2 - (uint)(uVar1 == 0);
LAB_001deef1:
  uVar1 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar1]);
  uVar1 = uVar1 + iVar4;
  lVar3 = 0;
  if (uVar1 < 0x20) {
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar1]);
    lVar3 = 3;
  }
  DVar2 = (*(code *)((long)&DAT_00362b90 + (long)(int)(&DAT_00362b90)[lVar3]))();
  return DVar2;
}

Assistant:

static DecodeStatus DecodeVLD2LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0, inc = 1;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			index = fieldFromInstruction_4(Insn, 5, 3);
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 2;
			break;
		case 1:
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 4;
			if (fieldFromInstruction_4(Insn, 5, 1))
				inc = 2;
			break;
		case 2:
			if (fieldFromInstruction_4(Insn, 5, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 7, 1);
			if (fieldFromInstruction_4(Insn, 4, 1) != 0)
				align = 8;
			if (fieldFromInstruction_4(Insn, 6, 1))
				inc = 2;
			break;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}